

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_log.c
# Opt level: O0

void zt_log_lprintf(zt_log_ty *log,zt_log_level level,char *fmt,...)

{
  char in_AL;
  char *in_RCX;
  zt_log_level in_ESI;
  zt_log_ty *in_RDI;
  __va_list_tag *in_XMM1_Qa;
  char *in_XMM1_Qb;
  undefined8 in_XMM2_Qa;
  zt_log_ty *in_XMM2_Qb;
  va_list ap;
  char *in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff2c;
  __va_list_tag *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  zt_log_level level_00;
  zt_log_ty *in_stack_ffffffffffffff70;
  zt_log_ty *local_8;
  
  level_00 = (zt_log_level)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  if (in_AL != '\0') {
    in_stack_ffffffffffffff58 = in_XMM1_Qa;
    in_stack_ffffffffffffff60 = in_XMM1_Qb;
    in_stack_ffffffffffffff70 = in_XMM2_Qb;
    level_00 = (zt_log_level)((ulong)in_XMM2_Qa >> 0x20);
  }
  local_8 = in_RDI;
  if ((in_RDI == (zt_log_ty *)0x0) && (local_8 = zt_log_get_logger(), local_8 == (zt_log_ty *)0x0))
  {
    zt_log_set_debug_info(in_RCX,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
    return;
  }
  if (local_8->level < in_ESI) {
    zt_log_set_debug_info(in_RCX,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff20);
  }
  else {
    zt_log_lvprintf(in_stack_ffffffffffffff70,level_00,in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

void
zt_log_lprintf(zt_log_ty * log, zt_log_level level, const char * fmt, ...) {
    va_list ap;

    if (!log && ((log = zt_log_get_logger()) == NULL)) {
        zt_log_set_debug_info(NULL, -1, NULL);
        return;
    }

    if (level > log->level) {
        zt_log_set_debug_info(NULL, -1, NULL);
        return;
    }
    va_start(ap, fmt);
    zt_log_lvprintf(log, level, fmt, ap);
    va_end(ap);
}